

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.h
# Opt level: O0

int __thiscall ArgParser::ArgIterator::option(ArgIterator *this)

{
  range_error *this_00;
  ArgIterator *this_local;
  
  if (this->i == this->argc) {
    this_00 = (range_error *)__cxa_allocate_exception(0x10);
    std::range_error::range_error(this_00,"arg out of range");
    __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
  }
  if (*this->p == '-') {
    this->isoption = this->p[1] != '\0';
    this_local._4_4_ = (int)this->p[1];
  }
  else {
    this->isoption = false;
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int option()
        {
            if (i==argc)
                throw std::range_error("arg out of range");
            if (*p=='-') {
                // a single '-' by itself is not considered an option,
                // so 'getstr()' will return "-"
                isoption = p[1]!=0;
                return p[1];
            }
            isoption = false;
            return -1;
        }